

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

Mat4x3 * __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,12>
          (Mat4x3 *__return_storage_ptr__,MatrixCaseUtils *this,ShaderEvalContext *evalCtx,
          int inputNdx)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  tcu::Matrix<float,_3,_4>::Matrix(__return_storage_ptr__);
  fVar3 = *(float *)(this + 0x34);
  fVar4 = *(float *)(this + 0x38);
  fVar5 = *(float *)(this + 0x44);
  fVar6 = *(float *)(this + 0x48);
  fVar1 = *(float *)(this + 0x40);
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = *(float *)(this + 0x30);
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = fVar3;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = fVar4;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = fVar1;
  uVar2 = *(undefined8 *)(this + 0x50);
  fVar3 = *(float *)(this + 0x58);
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = fVar5;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = fVar6;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = (float)uVar2;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = (float)((ulong)uVar2 >> 0x20);
  fVar4 = *(float *)(this + 100);
  fVar5 = *(float *)(this + 0x68);
  fVar1 = *(float *)(this + 0x60);
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = fVar3;
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = fVar1;
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = fVar4;
  (__return_storage_ptr__->m_data).m_data[3].m_data[2] = fVar5;
  return __return_storage_ptr__;
}

Assistant:

inline tcu::Mat4x3 getInputValue<INPUTTYPE_DYNAMIC, TYPE_FLOAT_MAT4X3> (const ShaderEvalContext& evalCtx, int inputNdx)
{
	DE_UNREF(inputNdx); // Not used.
	tcu::Mat4x3 m;
	m.setColumn(0, evalCtx.in[0].swizzle(0,1,2));
	m.setColumn(1, evalCtx.in[1].swizzle(0,1,2));
	m.setColumn(2, evalCtx.in[2].swizzle(0,1,2));
	m.setColumn(3, evalCtx.in[3].swizzle(0,1,2));
	return m;
}